

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_encoder.cc
# Opt level: O2

Status * __thiscall
draco::StlEncoder::EncodeInternal(Status *__return_storage_ptr__,StlEncoder *this)

{
  pointer paVar1;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> this_00;
  uint uVar2;
  uint uVar3;
  Mesh *pMVar4;
  ulong uVar5;
  long lVar6;
  uint16_t unused;
  Vector3f pos [3];
  long local_248;
  Vector3f norm;
  uint32_t num_faces;
  vector<unsigned_char,_std::allocator<unsigned_char>_> stl_face;
  VectorD<float,_3> local_1f4;
  string header_str;
  VectorD<float,_3> local_1c4;
  stringstream out;
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [88];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&out);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f | 0x20;
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0x50;
  std::operator<<((ostream *)local_1a8,"generated using Draco");
  std::__cxx11::stringbuf::str();
  EncoderBuffer::Encode(this->out_buffer_,header_str._M_dataplus._M_p,header_str._M_string_length);
  num_faces = (uint32_t)
              (((long)(this->in_mesh_->faces_).vector_.
                      super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->in_mesh_->faces_).vector_.
                     super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0xc);
  EncoderBuffer::Encode(this->out_buffer_,&num_faces,4);
  stl_face.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  stl_face.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  stl_face.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = PointCloud::GetNamedAttributeId(&this->in_mesh_->super_PointCloud,POSITION);
  if ((int)uVar2 < 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)pos,"Mesh is missing the position attribute.",(allocator<char> *)&norm);
    ErrorStatus(__return_storage_ptr__,(string *)pos);
  }
  else {
    pMVar4 = this->in_mesh_;
    if (*(int *)((long)(pMVar4->super_PointCloud).attributes_.
                       super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar2]._M_t.
                       super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                       ._M_t + 0x1c) == 9) {
      unused = 0;
      local_248 = 0;
      uVar5 = 0;
      while( true ) {
        paVar1 = (pMVar4->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((((long)(pMVar4->faces_).vector_.
                    super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)paVar1) / 0xc & 0xffffffffU)
            <= uVar5) break;
        this_00._M_t.
        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
        .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
             (pMVar4->super_PointCloud).attributes_.
             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar2]._M_t.
             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
             ._M_t;
        lVar6 = 0;
        do {
          VectorD<float,_3>::VectorD((VectorD<float,_3> *)((long)pos[0].v_._M_elems + lVar6));
          lVar6 = lVar6 + 0xc;
        } while (lVar6 != 0x24);
        PointAttribute::GetMappedValue
                  ((PointAttribute *)
                   this_00._M_t.
                   super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                   .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl,
                   (PointIndex)paVar1[uVar5]._M_elems[0].value_,pos);
        PointAttribute::GetMappedValue
                  ((PointAttribute *)
                   this_00._M_t.
                   super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                   .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl,
                   (PointIndex)paVar1[uVar5]._M_elems[1].value_,pos + 1);
        PointAttribute::GetMappedValue
                  ((PointAttribute *)
                   this_00._M_t.
                   super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                   .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl,
                   (PointIndex)paVar1[uVar5]._M_elems[2].value_,pos + 2);
        VectorD<float,_3>::operator-(&local_1f4,pos + 1);
        VectorD<float,_3>::operator-(&local_1c4,pos + 2);
        CrossProduct<float>((draco *)&norm,&local_1f4,&local_1c4);
        VectorD<float,_3>::Normalize((VectorD<float,_3> *)&norm);
        EncoderBuffer::Encode(this->out_buffer_,(draco *)&norm,0xc);
        for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
          uVar3 = *(uint *)((long)(paVar1->_M_elems + lVar6) + local_248);
          if (*(bool *)((long)this_00._M_t.
                              super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                              .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                       100) == false) {
            uVar3 = *(uint *)(*(long *)&(((IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                                           *)((long)this_00._M_t.
                                                                                                        
                                                  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                                  .
                                                  super__Head_base<0UL,_draco::PointAttribute_*,_false>
                                                  ._M_head_impl + 0x48))->vector_).
                                        super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                                        ._M_impl + (ulong)uVar3 * 4);
          }
          EncoderBuffer::Encode
                    (this->out_buffer_,
                     (void *)((ulong)uVar3 *
                              *(int64_t *)
                               ((long)this_00._M_t.
                                      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                      .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                      _M_head_impl + 0x28) +
                              **(long **)this_00._M_t.
                                         super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                         .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                         _M_head_impl +
                             *(int64_t *)
                              ((long)this_00._M_t.
                                     super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                     .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                     _M_head_impl + 0x30)),
                     *(int64_t *)
                      ((long)this_00._M_t.
                             super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                             .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                      0x28));
        }
        EncoderBuffer::Encode(this->out_buffer_,&unused,2);
        uVar5 = uVar5 + 1;
        pMVar4 = this->in_mesh_;
        local_248 = local_248 + 0xc;
      }
      __return_storage_ptr__->code_ = OK;
      (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->error_msg_).field_2;
      (__return_storage_ptr__->error_msg_)._M_string_length = 0;
      (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
      goto LAB_0011e9cb;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)pos,"Mesh position attribute is not of type float32.",
               (allocator<char> *)&norm);
    ErrorStatus(__return_storage_ptr__,(string *)pos);
  }
  std::__cxx11::string::~string((string *)pos);
LAB_0011e9cb:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&stl_face.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::~string((string *)&header_str);
  std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

Status StlEncoder::EncodeInternal() {
  // Write STL header.
  std::stringstream out;
  out << std::left << std::setw(80)
      << "generated using Draco";  // header is 80 bytes fixed size.
  const std::string header_str = out.str();
  buffer()->Encode(header_str.data(), header_str.length());

  uint32_t num_faces = in_mesh_->num_faces();
  buffer()->Encode(&num_faces, 4);

  std::vector<uint8_t> stl_face;

  const int pos_att_id =
      in_mesh_->GetNamedAttributeId(GeometryAttribute::POSITION);

  if (pos_att_id < 0) {
    return ErrorStatus("Mesh is missing the position attribute.");
  }

  if (in_mesh_->attribute(pos_att_id)->data_type() != DT_FLOAT32) {
    return ErrorStatus("Mesh position attribute is not of type float32.");
  }

  uint16_t unused = 0;

  if (in_mesh_) {
    for (FaceIndex i(0); i < in_mesh_->num_faces(); ++i) {
      const auto &f = in_mesh_->face(i);
      const auto *const pos_att = in_mesh_->attribute(pos_att_id);

      // The normal attribute can contain arbitrary normals that may not
      // correspond to the winding of the face.
      // Therefor we simply always calculate them
      // using the points of the triangle face: norm(cross(p2-p1, p3-p1))

      Vector3f pos[3];
      pos_att->GetMappedValue(f[0], &pos[0][0]);
      pos_att->GetMappedValue(f[1], &pos[1][0]);
      pos_att->GetMappedValue(f[2], &pos[2][0]);
      Vector3f norm = CrossProduct(pos[1] - pos[0], pos[2] - pos[0]);
      norm.Normalize();
      buffer()->Encode(norm.data(), sizeof(float) * 3);

      for (int c = 0; c < 3; ++c) {
        buffer()->Encode(pos_att->GetAddress(pos_att->mapped_index(f[c])),
                         pos_att->byte_stride());
      }

      buffer()->Encode(&unused, 2);
    }
  }
  return OkStatus();
}